

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall InterpreterTestSuite::TestContext::TestContext(TestContext *this)

{
  CommissionerAppMock *this_00;
  TestContext *this_local;
  
  ot::commissioner::Interpreter::Interpreter(&this->mInterpreter);
  this->mRegistry = (Registry *)0x0;
  this_00 = (CommissionerAppMock *)operator_new(0x1838);
  memset(this_00,0,0x1838);
  CommissionerAppMock::CommissionerAppMock(this_00);
  std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
            (&this->mDefaultCommissionerObject,this_00);
  CommissionerAppStaticExpecter::CommissionerAppStaticExpecter
            (&this->mCommissionerAppStaticExpecter);
  SetCommissionerAppStaticExpecter(&this->mCommissionerAppStaticExpecter);
  return;
}

Assistant:

TestContext() { SetCommissionerAppStaticExpecter(&mCommissionerAppStaticExpecter); }